

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int OptInit(char **a,s_options *o,FILE *err)

{
  char cVar1;
  option_type oVar2;
  char *pcVar3;
  code *pcVar4;
  s_options *psVar5;
  long lVar6;
  char **ppcVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  char **ppcVar13;
  char *pcVar14;
  int n;
  long lVar15;
  double dVar16;
  char *local_40;
  char **local_38;
  
  g_argv = a;
  op = o;
  errstream = err;
  if (((a != (char **)0x0) && (o != (s_options *)0x0)) && (*a != (char *)0x0)) {
    iVar9 = 0;
    local_38 = a;
    for (lVar15 = 1; ppcVar7 = g_argv, pcVar14 = g_argv[lVar15], pcVar14 != (char *)0x0;
        lVar15 = lVar15 + 1) {
      cVar1 = *pcVar14;
      n = (int)lVar15;
      if ((cVar1 == '-') || (cVar1 == '+')) {
        ppcVar7 = &op->label;
        do {
          ppcVar13 = ppcVar7;
          pcVar3 = *ppcVar13;
          if (pcVar3 == (char *)0x0) {
            iVar8 = 1;
            if (err == (FILE *)0x0) goto LAB_0010455c;
            pcVar14 = "%sundefined option.\n";
            goto LAB_00104430;
          }
          sVar10 = strlen(pcVar3);
          iVar8 = strncmp(pcVar14 + 1,pcVar3,(long)(int)sVar10);
          ppcVar7 = ppcVar13 + 4;
        } while (iVar8 != 0);
        pcVar4 = (code *)ppcVar13[1];
        iVar8 = 0;
        if (pcVar4 != (code *)0x0) {
          oVar2 = ((s_options *)(ppcVar13 + -1))->type;
          if (oVar2 == OPT_FSTR) {
            (*pcVar4)(pcVar14 + 2);
          }
          else if (oVar2 == OPT_FFLAG) {
            (*pcVar4)();
          }
          else if (oVar2 == OPT_FLAG) {
            *(uint *)pcVar4 = (uint)(cVar1 == '-');
          }
          else {
            iVar8 = 1;
            if (err != (FILE *)0x0) {
              pcVar14 = "%smissing argument on switch.\n";
LAB_00104430:
              fprintf((FILE *)err,pcVar14,emsg);
              iVar8 = 1;
              errline(n,1,err);
            }
          }
        }
LAB_0010455c:
        iVar9 = iVar9 + iVar8;
      }
      else {
        pcVar14 = strchr(pcVar14,0x3d);
        if (pcVar14 != (char *)0x0) {
          *pcVar14 = '\0';
          psVar5 = op;
          lVar6 = 0;
          do {
            lVar12 = lVar6;
            pcVar3 = *(char **)((long)&psVar5->label + lVar12);
            if (pcVar3 == (char *)0x0) break;
            iVar8 = strcmp(ppcVar7[lVar15],pcVar3);
            lVar6 = lVar12 + 0x20;
          } while (iVar8 != 0);
          *pcVar14 = '=';
          if (*(long *)((long)&psVar5->label + lVar12) == 0) {
            iVar8 = 1;
            if (err != (FILE *)0x0) {
              fprintf((FILE *)err,"%sundefined option.\n",emsg);
              errline(n,0,err);
              iVar8 = 1;
            }
          }
          else {
            iVar8 = *(int *)((long)&psVar5->type + lVar12);
            dVar16 = 0.0;
            if (iVar8 - 1U < 8) {
              pcVar14 = pcVar14 + 1;
              switch(iVar8) {
              default:
                if (err != (FILE *)0x0) {
                  fprintf((FILE *)err,"%soption requires an argument.\n",emsg);
                  errline(n,0,err);
                  dVar16 = 0.0;
                }
                break;
              case 2:
              case 6:
                iVar8 = 0;
                uVar11 = strtol(pcVar14,&local_40,0);
                pcVar14 = local_40;
                if (*local_40 != '\0') {
                  if (err != (FILE *)0x0) {
                    fprintf((FILE *)err,"%sillegal character in integer argument.\n",emsg);
                    errline(n,(int)pcVar14 - *(int *)(g_argv + lVar15),err);
                  }
                  iVar8 = 1;
                }
                pcVar14 = (char *)0x0;
                dVar16 = 0.0;
                goto LAB_00104665;
              case 3:
              case 7:
                dVar16 = strtod(pcVar14,&local_40);
                pcVar14 = local_40;
                if (*local_40 == '\0') goto LAB_0010465f;
                if (err != (FILE *)0x0) {
                  fprintf((FILE *)err,"%sillegal character in floating-point argument.\n",emsg);
                  errline(n,(int)pcVar14 - *(int *)(g_argv + lVar15),err);
                }
                break;
              case 4:
              case 8:
                goto switchD_001044ce_caseD_4;
              }
              uVar11 = 0;
              pcVar14 = (char *)0x0;
              iVar8 = 1;
            }
            else {
LAB_0010465f:
              pcVar14 = (char *)0x0;
switchD_001044ce_caseD_4:
              uVar11 = 0;
              iVar8 = 0;
            }
LAB_00104665:
            switch(*(undefined4 *)((long)&op->type + lVar12)) {
            case 2:
              **(undefined4 **)((long)&op->arg + lVar12) = (int)uVar11;
              break;
            case 3:
              **(double **)((long)&op->arg + lVar12) = dVar16;
              break;
            case 4:
              **(undefined8 **)((long)&op->arg + lVar12) = pcVar14;
              break;
            case 6:
              (**(code **)((long)&op->arg + lVar12))(uVar11 & 0xffffffff);
              break;
            case 7:
              (**(code **)((long)&op->arg + lVar12))();
              break;
            case 8:
              (**(code **)((long)&op->arg + lVar12))(pcVar14);
            }
          }
          iVar9 = iVar8 + iVar9;
        }
      }
    }
    if (0 < iVar9) {
      fprintf((FILE *)err,"Valid command line options for \"%s\" are:\n",*local_38);
      OptPrint();
      exit(1);
    }
  }
  return 0;
}

Assistant:

int OptInit(char **a, struct s_options *o, FILE *err)
{
  int errcnt = 0;
  g_argv = a;
  op = o;
  errstream = err;
  if( g_argv && *g_argv && op ){
    int i;
    for(i=1; g_argv[i]; i++){
      if( g_argv[i][0]=='+' || g_argv[i][0]=='-' ){
        errcnt += handleflags(i,err);
      }else if( strchr(g_argv[i],'=') ){
        errcnt += handleswitch(i,err);
      }
    }
  }
  if( errcnt>0 ){
    fprintf(err,"Valid command line options for \"%s\" are:\n",*a);
    OptPrint();
    exit(1);
  }
  return 0;
}